

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

void SUNMatDestroy_Sparse(SUNMatrix A)

{
  void *__ptr;
  
  __ptr = A->content;
  if (*(void **)((long)__ptr + 0x20) != (void *)0x0) {
    free(*(void **)((long)__ptr + 0x20));
    __ptr = A->content;
    *(undefined8 *)((long)__ptr + 0x20) = 0;
  }
  if (*(void **)((long)__ptr + 0x30) != (void *)0x0) {
    free(*(void **)((long)__ptr + 0x30));
    __ptr = A->content;
    *(undefined8 *)((long)__ptr + 0x30) = 0;
    *(undefined8 *)((long)__ptr + 0x40) = 0;
    *(undefined8 *)((long)__ptr + 0x50) = 0;
  }
  if (*(void **)((long)__ptr + 0x38) != (void *)0x0) {
    free(*(void **)((long)__ptr + 0x38));
    __ptr = A->content;
    *(undefined8 *)((long)__ptr + 0x38) = 0;
    *(undefined8 *)((long)__ptr + 0x48) = 0;
    *(undefined8 *)((long)__ptr + 0x58) = 0;
  }
  free(__ptr);
  A->content = (void *)0x0;
  free(A->ops);
  free(A);
  return;
}

Assistant:

void SUNMatDestroy_Sparse(SUNMatrix A)
{
  /* perform operation */
  if (SM_DATA_S(A)) {
    free(SM_DATA_S(A));  SM_DATA_S(A) = NULL;
  }
  if (SM_INDEXVALS_S(A)) {
    free(SM_INDEXVALS_S(A));
    SM_INDEXVALS_S(A) = NULL;
    SM_CONTENT_S(A)->rowvals = NULL;
    SM_CONTENT_S(A)->colvals = NULL;
  }
  if (SM_INDEXPTRS_S(A)) {
    free(SM_INDEXPTRS_S(A));
    SM_INDEXPTRS_S(A) = NULL;
    SM_CONTENT_S(A)->colptrs = NULL;
    SM_CONTENT_S(A)->rowptrs = NULL;
  }
  free(A->content); A->content = NULL;
  free(A->ops);  A->ops = NULL;
  free(A); A = NULL;
  return;
}